

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O2

void prvTidyCleanHead(TidyDocImpl *doc)

{
  Node *pNVar1;
  Node *element;
  uint uVar2;
  Node *node;
  
  if ((*(int *)((doc->config).value + 6) != 1) &&
     (element = prvTidyFindHEAD(doc), element != (Node *)0x0)) {
    uVar2 = 0;
    pNVar1 = element->content;
    while (node = pNVar1, node != (Node *)0x0) {
      pNVar1 = node->next;
      if (((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_TITLE)) &&
         (uVar2 = uVar2 + 1, 1 < uVar2)) {
        prvTidyReport(doc,element,node,0x235);
        prvTidyDiscardElement(doc,node);
      }
    }
  }
  return;
}

Assistant:

void TY_(CleanHead)(TidyDocImpl* doc)
{
    Node *head, *node, *next;
    uint titles = 0;
    if (cfgAutoBool(doc, TidyBodyOnly) == TidyYesState)
        return; /* not going to show head, so forget it */
    head = TY_(FindHEAD)(doc);
    if (!head)
        return;
    node = head->content;
    while (node)
    {
        next = node->next;  /* get any 'next' */
        if (nodeIsTITLE(node))
        {
            titles++;
            if (titles > 1)
            {
                TY_(Report)(doc, head, node, DISCARDING_UNEXPECTED);
                TY_(DiscardElement)(doc, node); /* delete this node */
            }
        }
        node = next;
    }
}